

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

QRect __thiscall
QAbstractItemViewPrivate::intersectedRect
          (QAbstractItemViewPrivate *this,QRect rect,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  long *plVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  QRect QVar6;
  undefined1 local_a0 [24];
  QRect local_88;
  QRect local_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QRect local_48;
  long local_38;
  
  local_48._8_8_ = rect._8_8_;
  local_48._0_8_ = rect._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (topLeft->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_68 = (undefined1 *)0xffffffffffffffff;
    puStack_60 = (undefined1 *)0x0;
    local_58 = (undefined1 *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar2 + 0x68))(&local_68,pQVar2,topLeft);
  }
  QVar6 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  if (topLeft->r <= bottomRight->r) {
    iVar4 = topLeft->r;
    QVar6 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    do {
      iVar5 = topLeft->c;
      if (topLeft->c <= bottomRight->c) {
        do {
          local_78 = QVar6;
          (**(code **)(*(long *)this->model + 0x60))(local_a0,this->model,iVar4,iVar5,&local_68);
          QVar6 = (QRect)(**(code **)(*plVar1 + 0x1e0))(plVar1,local_a0);
          local_88 = QVar6;
          QVar6 = (QRect)QRect::operator|(&local_78,&local_88);
          bVar3 = iVar5 < bottomRight->c;
          iVar5 = iVar5 + 1;
        } while (bVar3);
      }
      bVar3 = iVar4 < bottomRight->r;
      iVar4 = iVar4 + 1;
    } while (bVar3);
  }
  local_78 = QVar6;
  QVar6 = (QRect)QRect::operator&(&local_48,&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAbstractItemViewPrivate::intersectedRect(const QRect rect, const QModelIndex &topLeft, const QModelIndex &bottomRight) const
{
    Q_Q(const QAbstractItemView);

    const auto parentIdx = topLeft.parent();
    QRect updateRect;
    for (int r = topLeft.row(); r <= bottomRight.row(); ++r) {
        for (int c = topLeft.column(); c <= bottomRight.column(); ++c)
            updateRect |= q->visualRect(model->index(r, c, parentIdx));
    }
    return rect.intersected(updateRect);
}